

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_systemz.c
# Opt level: O0

void test(void)

{
  bool bVar1;
  cs_err cVar2;
  size_t count_00;
  ulong local_58;
  size_t j;
  cs_err err;
  size_t count;
  cs_insn *pcStack_38;
  int i;
  cs_insn *insn;
  uint64_t address;
  platform platforms [1];
  
  address = 0x8000000000000006;
  platforms[0]._0_8_ = anon_var_dwarf_23;
  platforms[0].code = (uchar *)0x2e;
  platforms[0].size = (size_t)anon_var_dwarf_41;
  insn = (cs_insn *)0x1000;
  bVar1 = false;
  while (!bVar1) {
    cVar2 = cs_open((cs_arch)address,address._4_4_,&handle);
    if (cVar2 == CS_ERR_OK) {
      cs_option(handle,CS_OPT_DETAIL,3);
      count_00 = cs_disasm(handle,(uint8_t *)platforms[0]._0_8_,(size_t)platforms[0].code,
                           (uint64_t)insn,0,&stack0xffffffffffffffc8);
      if (count_00 == 0) {
        printf("****************\n");
        printf("Platform: %s\n",platforms[0].size);
        print_string_hex("Code:",(uchar *)platforms[0]._0_8_,(size_t)platforms[0].code);
        printf("ERROR: Failed to disasm given code!\n");
      }
      else {
        printf("****************\n");
        printf("Platform: %s\n",platforms[0].size);
        print_string_hex("Code:",(uchar *)platforms[0]._0_8_,(size_t)platforms[0].code);
        printf("Disasm:\n");
        for (local_58 = 0; local_58 < count_00; local_58 = local_58 + 1) {
          printf("0x%lx:\t%s\t%s\n",pcStack_38[local_58].address,pcStack_38[local_58].mnemonic,
                 pcStack_38[local_58].op_str);
          print_insn_detail(pcStack_38 + local_58);
        }
        printf("0x%lx:\n",pcStack_38[local_58 - 1].address + (ulong)pcStack_38[local_58 - 1].size);
        cs_free(pcStack_38,count_00);
      }
      printf("\n");
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar2);
    }
    bVar1 = true;
  }
  return;
}

Assistant:

static void test()
{
#define SYSZ_CODE "\xed\x00\x00\x00\x00\x1a\x5a\x0f\x1f\xff\xc2\x09\x80\x00\x00\x00\x07\xf7\xeb\x2a\xff\xff\x7f\x57\xe3\x01\xff\xff\x7f\x57\xeb\x00\xf0\x00\x00\x24\xb2\x4f\x00\x78\xec\x18\x00\x00\xc1\x7f"

	struct platform platforms[] = {
		{
			CS_ARCH_SYSZ,
			CS_MODE_BIG_ENDIAN,
			(unsigned char*)SYSZ_CODE,
			sizeof(SYSZ_CODE) - 1,
			"SystemZ",
		},
	};

	uint64_t address = 0x1000;
	cs_insn *insn;
	int i;
	size_t count;

	for (i = 0; i < sizeof(platforms)/sizeof(platforms[0]); i++) {
		cs_err err = cs_open(platforms[i].arch, platforms[i].mode, &handle);
		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON);

		count = cs_disasm(handle, platforms[i].code, platforms[i].size, address, 0, &insn);
		if (count) {
			size_t j;

			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("Disasm:\n");

			for (j = 0; j < count; j++) {
				printf("0x%"PRIx64":\t%s\t%s\n", insn[j].address, insn[j].mnemonic, insn[j].op_str);
				print_insn_detail(&insn[j]);
			}
			printf("0x%"PRIx64":\n", insn[j-1].address + insn[j-1].size);

			// free memory allocated by cs_disasm()
			cs_free(insn, count);
		} else {
			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("ERROR: Failed to disasm given code!\n");
		}

		printf("\n");

		cs_close(&handle);
	}
}